

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *flags,cmGeneratorTarget *target,string *lang,string *config)

{
  _Rb_tree_node_base *lang_00;
  pointer *ppbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  ManagedType MVar4;
  cmValue cVar5;
  cmValue cVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  string *psVar9;
  char *extraout_RDX;
  string_view value;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  cmValue wErrorOpts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec;
  cmValue wError;
  string compReqFlag;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetCompileOpts;
  string local_78;
  cmStandardLevelResolver standardResolver;
  string langFlagRegexVar;
  
  targetCompileOpts.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000006;
  targetCompileOpts.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6817eb;
  opts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lang->_M_dataplus)._M_p;
  opts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)lang->_M_string_length;
  cmStrCat<char[12]>(&langFlagRegexVar,(cmAlphaNum *)&targetCompileOpts,(cmAlphaNum *)&opts,
                     (char (*) [12])"_FLAG_REGEX");
  cVar5 = cmMakefile::GetDefinition(this->Makefile,&langFlagRegexVar);
  if (cVar5.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetCompileOpts,"COMPILE_FLAGS",(allocator<char> *)&opts);
    cVar5 = cmGeneratorTarget::GetProperty(target,(string *)&targetCompileOpts);
    std::__cxx11::string::~string((string *)&targetCompileOpts);
    if (cVar5.Value != (string *)0x0) {
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&targetCompileOpts.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      (*this->_vptr_cmLocalGenerator[6])(this,&targetCompileOpts,cVar5.Value);
      if (targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targetCompileOpts);
      }
      std::__cxx11::string::~string((string *)&targetCompileOpts);
    }
    cmGeneratorTarget::GetCompileOptions(&targetCompileOpts,target,config,lang);
    AppendCompileOptions(this,flags,&targetCompileOpts,(char *)0x0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetCompileOpts,"COMPILE_FLAGS",(allocator<char> *)&opts);
    cVar6 = cmGeneratorTarget::GetProperty(target,(string *)&targetCompileOpts);
    std::__cxx11::string::~string((string *)&targetCompileOpts);
    if (cVar6.Value != (string *)0x0) {
      opts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      opts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      opts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ParseWindowsCommandLine(((cVar6.Value)->_M_dataplus)._M_p,&opts);
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&targetCompileOpts.
                     super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      targetCompileOpts.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      AppendCompileOptions
                (this,(string *)&targetCompileOpts,&opts,((cVar5.Value)->_M_dataplus)._M_p);
      if (targetCompileOpts.
          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targetCompileOpts);
      }
      std::__cxx11::string::~string((string *)&targetCompileOpts);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&opts);
    }
    cmGeneratorTarget::GetCompileOptions(&targetCompileOpts,target,config,lang);
    AppendCompileOptions(this,flags,&targetCompileOpts,((cVar5.Value)->_M_dataplus)._M_p);
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&targetCompileOpts);
  standardResolver.Makefile = this->Makefile;
  p_Var7 = (target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var7 ==
        &(target->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header) {
      compReqFlag._M_dataplus._M_p = (pointer)&compReqFlag.field_2;
      compReqFlag._M_string_length = 0;
      compReqFlag.field_2._M_local_buf[0] = '\0';
      AddCompilerRequirementFlag(this,&compReqFlag,target,lang,config);
      if (compReqFlag._M_string_length != 0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,&compReqFlag);
      }
      if (this->GlobalGenerator->CMakeInstance->IgnoreWarningAsError == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targetCompileOpts,"COMPILE_WARNING_AS_ERROR",(allocator<char> *)&opts)
        ;
        wError = cmGeneratorTarget::GetProperty(target,(string *)&targetCompileOpts);
        std::__cxx11::string::~string((string *)&targetCompileOpts);
        pcVar2 = this->Makefile;
        targetCompileOpts.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000006;
        targetCompileOpts.
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x6817eb;
        opts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(lang->_M_dataplus)._M_p;
        opts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)lang->_M_string_length;
        cmStrCat<char[34]>((string *)&optVec,(cmAlphaNum *)&targetCompileOpts,(cmAlphaNum *)&opts,
                           (char (*) [34])"_COMPILE_OPTIONS_WARNING_AS_ERROR");
        wErrorOpts = cmMakefile::GetDefinition(pcVar2,(string *)&optVec);
        std::__cxx11::string::~string((string *)&optVec);
        bVar3 = cmValue::IsOn(&wError);
        if (bVar3) {
          bVar3 = cmValue::IsSet(&wErrorOpts);
          if (bVar3) {
            targetCompileOpts.
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&targetCompileOpts.
                           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            targetCompileOpts.
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            targetCompileOpts.
            super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
            cVar5 = wErrorOpts;
            if (wErrorOpts.Value == (string *)0x0) {
              cVar5.Value = &cmValue::Empty_abi_cxx11_;
            }
            AppendCompileOptions(this,(string *)&targetCompileOpts,cVar5.Value,(char *)0x0);
            if (targetCompileOpts.
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&targetCompileOpts);
            }
            std::__cxx11::string::~string((string *)&targetCompileOpts);
          }
        }
      }
      pcVar2 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts,
                     "CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &targetCompileOpts,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opts,
                     "_COMPILE_OPTIONS_JMC");
      cVar5 = cmMakefile::GetDefinition(pcVar2,(string *)&targetCompileOpts);
      std::__cxx11::string::~string((string *)&targetCompileOpts);
      std::__cxx11::string::~string((string *)&opts);
      if (cVar5.Value != (string *)0x0) {
        MVar4 = cmGeneratorTarget::GetManagedType(target,config);
        if (MVar4 != Managed) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&targetCompileOpts,"VS_JUST_MY_CODE_DEBUGGING",
                     (allocator<char> *)&opts);
          cVar6 = cmGeneratorTarget::GetProperty(target,(string *)&targetCompileOpts);
          std::__cxx11::string::~string((string *)&targetCompileOpts);
          if (cVar6.Value != (string *)0x0) {
            std::__cxx11::string::string((string *)&local_78,(string *)cVar6.Value);
            ppbVar1 = &opts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            opts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            opts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)opts.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage &
                          0xffffffffffffff00);
            opts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
            cmGeneratorExpression::Evaluate
                      ((string *)&targetCompileOpts,&local_78,this,config,(cmGeneratorTarget *)0x0,
                       (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                       (string *)&opts);
            std::__cxx11::string::~string((string *)&opts);
            std::__cxx11::string::~string((string *)&local_78);
            value._M_str = extraout_RDX;
            value._M_len = (size_t)targetCompileOpts.
                                   super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
            bVar3 = cmValue::IsOn((cmValue *)
                                  targetCompileOpts.
                                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,value);
            if (bVar3) {
              arg._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
              arg._M_len = (cVar5.Value)->_M_string_length;
              cmExpandedList_abi_cxx11_(&optVec,arg,false);
              opts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              opts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)opts.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              opts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
              AppendCompileOptions(this,(string *)&opts,&optVec,(char *)0x0);
              if (opts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                emplace_back<std::__cxx11::string>
                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            *)flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&opts);
              }
              std::__cxx11::string::~string((string *)&opts);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&optVec);
            }
            std::__cxx11::string::~string((string *)&targetCompileOpts);
          }
        }
      }
      std::__cxx11::string::~string((string *)&compReqFlag);
LAB_00390a7a:
      std::__cxx11::string::~string((string *)&langFlagRegexVar);
      return;
    }
    lang_00 = p_Var7 + 1;
    cVar5 = cmGeneratorTarget::GetLanguageStandard(target,(string *)lang_00,config);
    if (cVar5.Value != (string *)0x0) {
      bVar3 = cmStandardLevelResolver::IsLaterStandard
                        (&standardResolver,(string *)lang_00,cVar5.Value,(string *)(p_Var7 + 2));
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&targetCompileOpts);
        poVar8 = std::operator<<((ostream *)&targetCompileOpts,
                                 "The COMPILE_FEATURES property of target \"");
        psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        poVar8 = std::operator<<(poVar8,
                                 "\" was evaluated when computing the link implementation, and the \""
                                );
        poVar8 = std::operator<<(poVar8,(string *)lang_00);
        poVar8 = std::operator<<(poVar8,"_STANDARD\" was \"");
        poVar8 = std::operator<<(poVar8,(string *)(p_Var7 + 2));
        poVar8 = std::operator<<(poVar8,
                                 "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                                );
        poVar8 = std::operator<<(poVar8,(string *)lang_00);
        poVar8 = std::operator<<(poVar8,"_STANDARD\" \"");
        poVar8 = std::operator<<(poVar8,(string *)cVar5.Value);
        std::operator<<(poVar8,
                        "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation.\n"
                       );
        std::__cxx11::stringbuf::str();
        IssueMessage(this,FATAL_ERROR,(string *)&opts);
        std::__cxx11::string::~string((string *)&opts);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targetCompileOpts);
        goto LAB_00390a7a;
      }
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::vector<BT<std::string>>& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = cmStrCat("CMAKE_", lang, "_FLAG_REGEX");

  if (cmValue langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    if (cmValue targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      std::vector<std::string> opts;
      cmSystemTools::ParseWindowsCommandLine(targetFlags->c_str(), opts);
      // Re-escape these flags since COMPILE_FLAGS were already parsed
      // as a command line above.
      std::string compileOpts;
      this->AppendCompileOptions(compileOpts, opts, langFlagRegexStr->c_str());
      if (!compileOpts.empty()) {
        flags.emplace_back(std::move(compileOpts));
      }
    }
    std::vector<BT<std::string>> targetCompileOpts =
      target->GetCompileOptions(config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, targetCompileOpts,
                               langFlagRegexStr->c_str());
  } else {
    // Use all flags.
    if (cmValue targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      std::string compileFlags;
      this->AppendFlags(compileFlags, *targetFlags);
      if (!compileFlags.empty()) {
        flags.emplace_back(std::move(compileFlags));
      }
    }
    std::vector<BT<std::string>> targetCompileOpts =
      target->GetCompileOptions(config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, targetCompileOpts);
  }

  cmStandardLevelResolver standardResolver(this->Makefile);
  for (auto const& it : target->GetMaxLanguageStandards()) {
    cmValue standard = target->GetLanguageStandard(it.first, config);
    if (!standard) {
      continue;
    }
    if (standardResolver.IsLaterStandard(it.first, *standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << *standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation.\n";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  std::string compReqFlag;
  this->AddCompilerRequirementFlag(compReqFlag, target, lang, config);
  if (!compReqFlag.empty()) {
    flags.emplace_back(std::move(compReqFlag));
  }

  // Add Warning as errors flags
  if (!this->GetCMakeInstance()->GetIgnoreWarningAsError()) {
    const cmValue wError = target->GetProperty("COMPILE_WARNING_AS_ERROR");
    const cmValue wErrorOpts = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_WARNING_AS_ERROR"));
    if (wError.IsOn() && wErrorOpts.IsSet()) {
      std::string wErrorFlags;
      this->AppendCompileOptions(wErrorFlags, *wErrorOpts);
      if (!wErrorFlags.empty()) {
        flags.emplace_back(std::move(wErrorFlags));
      }
    }
  }

  // Add compile flag for the MSVC compiler only.
  cmMakefile* mf = this->GetMakefile();
  if (cmValue jmc =
        mf->GetDefinition("CMAKE_" + lang + "_COMPILE_OPTIONS_JMC")) {

    // Handle Just My Code debugging flags, /JMC.
    // If the target is a Managed C++ one, /JMC is not compatible.
    if (target->GetManagedType(config) !=
        cmGeneratorTarget::ManagedType::Managed) {
      // add /JMC flags if target property VS_JUST_MY_CODE_DEBUGGING is set
      // to ON
      if (cmValue jmcExprGen =
            target->GetProperty("VS_JUST_MY_CODE_DEBUGGING")) {
        std::string isJMCEnabled =
          cmGeneratorExpression::Evaluate(*jmcExprGen, this, config);
        if (cmIsOn(isJMCEnabled)) {
          std::vector<std::string> optVec = cmExpandedList(*jmc);
          std::string jmcFlags;
          this->AppendCompileOptions(jmcFlags, optVec);
          if (!jmcFlags.empty()) {
            flags.emplace_back(std::move(jmcFlags));
          }
        }
      }
    }
  }
}